

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  Matrix<double,_1,__1,_1,_1,__1> *pMVar7;
  undefined8 uVar8;
  size_type sVar9;
  Scalar *pSVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  Matrix<double,_1,__1,_1,_1,__1> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar14;
  int iVar15;
  DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
  *pDVar16;
  uint uVar17;
  DenseStorage<double,__1,_1,__1,_1> *pDVar18;
  ulong index;
  int iVar19;
  byte bVar20;
  Matrix<double,_1,__1,_1,_1,__1> MVar21;
  Matrix<double,_1,__1,_1,_1,__1> y;
  Matrix<double,_1,__1,_1,_1,__1> ypow;
  Matrix<double,_1,__1,_1,_1,__1> ypowp1;
  Matrix<double,_1,__1,_1,_1,__1> xnorm_adj;
  Matrix<double,_1,__1,_1,_1,__1> xnorm;
  Matrix<double,_1,__1,_1,_1,__1> jacd;
  Matrix<double,_1,__1,_1,_1,__1> jacdd;
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  uint local_444;
  uint local_440;
  scalar_product_op<double,_double> local_439;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_438;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_428;
  FeHierarchicTria<double> *local_418;
  ulong local_410;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_408;
  ulong local_3f8;
  Matrix<double,_1,__1,_1,_1,__1> *local_3f0;
  Scalar local_3e8;
  scalar_constant_op<double> local_3e0;
  DenseStorage<double,__1,_1,__1,_1> local_3d8;
  DenseStorage<double,__1,_1,__1,_1> local_3c8;
  Matrix<double,_1,__1,_1,_1,__1> *local_3b8;
  Rhs local_3b0;
  Rhs local_3a8;
  Lhs local_3a0;
  Rhs local_398;
  Lhs local_390;
  void *local_388 [2];
  Matrix<double,_1,__1,_1,_1,__1> local_378;
  Matrix<double,_1,__1,_1,_1,__1> local_368;
  Rhs local_358;
  undefined1 local_318 [16];
  RhsNested local_308;
  XprTypeNested pMStack_300;
  variable_if_dynamic<long,__1> local_2f8;
  variable_if_dynamic<long,__1> vStack_2f0;
  XprTypeNested local_2e8;
  undefined1 local_2a8;
  undefined1 local_298 [16];
  LhsNested local_288;
  scalar_constant_op<double> sStack_280;
  variable_if_dynamic<long,__1> local_278;
  variable_if_dynamic<long,__1> vStack_270;
  XprTypeNested local_268;
  variable_if_dynamic<long,__1> local_260;
  variable_if_dynamic<long,__1> local_258;
  undefined1 local_228;
  RhsNested local_1d8;
  undefined1 local_1b8 [16];
  variable_if_dynamic<long,__1> local_1a8;
  variable_if_dynamic<long,__1> vStack_1a0;
  scalar_constant_op<double> local_198;
  RhsNested RStack_190;
  Index local_188;
  Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false> local_170;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>
  local_138;
  void **local_f0 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_60;
  
  bVar20 = 0;
  iVar15 = 3;
  if (1 < *(uint *)((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                           ).m_storage.m_cols + 4)) {
    iVar15 = (int)*(undefined8 *)
                   (nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                    m_storage.m_cols + 0x18) + 3;
  }
  if (*(uint *)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_data < 2) {
    iVar19 = 0;
  }
  else {
    iVar19 = SUB84(nodevals[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_data[3],0);
  }
  if (*(uint *)((long)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_data + 4) < 2) {
    local_410 = 0;
  }
  else {
    local_410 = *(ulong *)(nodevals[2].
                           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                           m_cols + 0x18);
  }
  local_3f8 = (ulong)*(uint *)(nodevals[3].
                               super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                               m_storage.m_data + 3);
  local_3b8 = in_RDX;
  sVar9 = NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals,0);
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  this->interior_degree_ = 0;
  (this->edge_degrees_)._M_elems[0] = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,(ulong)sVar9);
  IVar14 = extraout_RDX;
  if (2 < (uint)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage
                .m_cols) {
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               (nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_data + 1),0);
    local_138.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    m_startCol.m_value = local_188;
    local_138.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)local_198.m_other;
    local_138.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    m_startRow.m_value = (long)RStack_190.m_expression;
    local_138.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
    m_rows.m_value = local_1a8.m_value;
    local_138.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
    m_cols.m_value = vStack_1a0.m_value;
    local_138.m_lhs.m_expression.m_matrix =
         (NestedExpressionType)(NestedExpressionType)local_1b8._0_8_;
    local_138.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
    m_data = (PointerType)local_1b8._8_8_;
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_358,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               (nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_data + 1),1);
    local_d8.m_lhs.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    m_startRow.m_value =
         local_358.m_expression.
         super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
         m_outerStride;
    local_d8.m_lhs.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
    m_cols.m_value =
         local_358.m_expression.
         super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
         m_startRow.m_value;
    local_d8.m_lhs.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)
         local_358.m_expression.
         super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
         m_startCol.m_value;
    local_d8.m_lhs.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
    m_data = (PointerType)
             local_358.m_expression.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value;
    local_d8.m_lhs.m_rhs.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
    m_rows.m_value =
         (long)local_358.m_expression.
               super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
               .m_xpr;
    local_d8._0_8_ =
         local_358.m_expression.
         super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
         .m_data;
    local_d8.m_lhs.m_lhs.m_expression.m_matrix =
         (NestedExpressionType)
         (NestedExpressionType)
         local_358.m_expression.
         super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
         .m_rows.m_value;
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                     *)local_318,(Lhs *)&local_138,(Rhs *)&local_d8,
                    (scalar_quotient_op<double,_double> *)&local_170);
    puVar11 = (undefined8 *)local_318;
    pDVar16 = (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)local_298;
    for (lVar12 = 0xe; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(undefined8 *)pDVar16 = *puVar11;
      puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
      pDVar16 = pDVar16 + (ulong)bVar20 * -0x10 + 8;
    }
    local_228 = local_2a8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
    PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_3c8,
               (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                *)local_298);
    if (*(int *)nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_cols == 1) {
      Eigen::DenseStorage<double,_-1,_1,_-1,_1>::DenseStorage(&local_3d8,&local_3c8);
    }
    else {
      local_d8._0_8_ = &DAT_3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        *)local_318,1,local_3f8,(scalar_constant_op<double> *)&local_d8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                       *)local_298,(Lhs *)local_318,(Rhs *)&local_3c8,
                      (scalar_difference_op<double,_double> *)&local_d8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,1,_1,1,1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_3d8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                  *)local_298);
    }
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_298,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               (nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_data + 1),1);
    local_438.m_storage.m_data = (double *)0x0;
    local_438.m_storage.m_cols = 0;
    if ((local_288.m_expression.m_matrix != (non_const_type)0x0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
               SEXT816((long)local_288.m_expression.m_matrix),0) < 1)) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = &std::out_of_range::vtable;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&local_438,1,(Index)local_288.m_expression.m_matrix);
    pDVar18 = (DenseStorage<double,__1,_1,__1,_1> *)local_298._0_8_;
    lVar12 = *(Index *)((long)sStack_280.m_other + 8);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>,double,double>
              ((Matrix<double,_1,__1,_1,_1,__1> *)&local_438,
               (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_298,
               (assign_op<double,_double> *)local_318);
    if (0 < local_438.m_storage.m_cols) {
      lVar13 = 0;
      do {
        local_438.m_storage.m_data[lVar13] = (double)pDVar18->m_data;
        lVar13 = lVar13 + 1;
        pDVar18 = (DenseStorage<double,__1,_1,__1,_1> *)(&pDVar18->m_data + lVar12);
      } while (local_438.m_storage.m_cols != lVar13);
    }
    local_444 = 0;
    if ((int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
             m_cols != 2) {
      local_410 = (ulong)(uint)((int)local_410 + iVar15 + iVar19);
      uVar17 = 0;
      local_418 = this;
      local_3f0 = nodevals;
      do {
        local_298._0_8_ = &local_438;
        local_298._8_8_ = &local_444;
        local_428.m_storage.m_data = (double *)0x0;
        local_428.m_storage.m_cols = 0;
        if ((local_438.m_storage.m_cols != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                   SEXT816(local_438.m_storage.m_cols),0) < 1)) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = &std::out_of_range::vtable;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  (&local_428,1,local_438.m_storage.m_cols);
        uVar8 = local_298._8_8_;
        pdVar1 = ((DenseStorage<double,__1,_1,__1,_1> *)local_298._0_8_)->m_data;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const>,double,double>
                  ((Matrix<double,_1,__1,_1,_1,__1> *)&local_428,
                   (MatrixWrapper<const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1054:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                    *)local_298,(assign_op<double,_double> *)local_318);
        IVar14 = local_428.m_storage.m_cols;
        pdVar6 = local_428.m_storage.m_data;
        if (0 < local_428.m_storage.m_cols) {
          lVar12 = 0;
          do {
            dVar2 = pow(1.0 - pdVar1[lVar12],(double)*(uint *)uVar8);
            pdVar6[lVar12] = dVar2;
            lVar12 = lVar12 + 1;
          } while (IVar14 != lVar12);
        }
        local_298._0_8_ = &local_438;
        local_298._8_8_ = &local_444;
        local_408.m_storage.m_data = (double *)0x0;
        local_408.m_storage.m_cols = 0;
        if ((local_438.m_storage.m_cols != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                   SEXT816(local_438.m_storage.m_cols),0) < 1)) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = &std::out_of_range::vtable;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  (&local_408,1,local_438.m_storage.m_cols);
        uVar8 = local_298._8_8_;
        pdVar1 = ((DenseStorage<double,__1,_1,__1,_1> *)local_298._0_8_)->m_data;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const>,double,double>
                  ((Matrix<double,_1,__1,_1,_1,__1> *)&local_408,
                   (MatrixWrapper<const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1059:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                    *)local_298,(assign_op<double,_double> *)local_318);
        IVar14 = local_408.m_storage.m_cols;
        pdVar6 = local_408.m_storage.m_data;
        if (0 < local_408.m_storage.m_cols) {
          lVar12 = 0;
          do {
            dVar2 = pow(1.0 - pdVar1[lVar12],(double)(*(uint *)uVar8 + 1));
            pdVar6[lVar12] = dVar2;
            lVar12 = lVar12 + 1;
          } while (IVar14 != lVar12);
        }
        local_298._0_8_ = &local_3d8;
        local_298._8_8_ = &local_444;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
        PlainObjectBase<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_,Eigen::Matrix<double,1,_1,1,1,_1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_368,
                   (DenseBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1063:17),_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                    *)local_298);
        this = local_418;
        local_440 = 0;
        if ((int)(local_3f0->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                 m_storage.m_cols - 2U != local_444) {
          do {
            pMVar7 = local_3f0;
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                      ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                       local_318,
                       (Matrix<double,__1,__1,_0,__1,__1> *)
                       (local_3f0[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_data + 1),1);
            local_268 = local_2e8;
            local_278.m_value = local_2f8.m_value;
            vStack_270.m_value = vStack_2f0.m_value;
            local_288.m_expression.m_matrix =
                 (NestedExpressionType)(NestedExpressionType)local_308.m_expression;
            sStack_280.m_other = (double)pMStack_300;
            local_298._0_8_ = local_318._0_8_;
            local_298._8_8_ = local_318._8_8_;
            local_260.m_value = (long)&local_440;
            local_258.m_value = (long)&local_444;
            Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
            PlainObjectBase<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_5_,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_378,
                       (DenseBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1067:56),_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                        *)local_298);
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                      ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                       local_318,
                       (Matrix<double,__1,__1,_0,__1,__1> *)
                       (pMVar7[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_data + 1),1);
            local_268 = local_2e8;
            local_278.m_value = local_2f8.m_value;
            vStack_270.m_value = vStack_2f0.m_value;
            local_288.m_expression.m_matrix =
                 (NestedExpressionType)(NestedExpressionType)local_308.m_expression;
            sStack_280.m_other = (double)pMStack_300;
            local_298._0_8_ = local_318._0_8_;
            local_298._8_8_ = local_318._8_8_;
            local_260.m_value = (long)&local_440;
            local_258.m_value = (long)&local_444;
            Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
            PlainObjectBase<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_6_,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)local_388,
                       (DenseBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1071:56),_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                        *)local_298);
            local_390.m_expression.m_matrix =
                 (NestedExpressionType)
                 (pMVar7[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                  .m_data + 4);
            Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>::Block
                      (&local_170,local_3b8,0,local_410,1,local_3f8);
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .m_outerStride =
                 local_170.
                 super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                 .m_outerStride;
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .m_startRow.m_value =
                 local_170.
                 super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                 .m_startRow.m_value;
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .m_startCol.m_value =
                 local_170.
                 super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                 .m_startCol.m_value;
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
            .m_cols.m_value =
                 local_170.
                 super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value;
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .m_xpr = local_170.
                     super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                     .m_xpr;
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
            .m_data = local_170.
                      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
                      .m_data;
            local_358.m_expression.
            super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
            .m_rows.m_value =
                 local_170.
                 super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
                 .m_rows.m_value;
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>_>
            ::CwiseBinaryOp(&local_138,&local_390,&local_358,
                            (scalar_product_op<double,_double> *)local_318);
            local_398.m_expression = &local_368;
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
            ::CwiseBinaryOp(&local_d8,&local_138,&local_398,
                            (scalar_product_op<double,_double> *)local_318);
            local_3a0.m_expression = (NestedExpressionType)&local_408;
            local_3a8.m_expression = &local_378;
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
            ::CwiseBinaryOp(&local_78,&local_3a0,&local_3a8,
                            (scalar_product_op<double,_double> *)local_1b8);
            local_3b0.m_expression = (NestedExpressionType)&local_428;
            local_3e0.m_other = (double)(local_444 * 2 + 4);
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                              *)local_f0,1,local_428.m_storage.m_cols,&local_3e0);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
            ::CwiseBinaryOp(&local_60,
                            (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                             *)local_f0,&local_3b0,&local_439);
            local_f0[0] = local_388;
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                             *)local_1b8,&local_60,(Rhs *)local_f0,
                            (scalar_product_op<double,_double> *)&local_3e0);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                             *)local_318,&local_78,(Rhs *)local_1b8,
                            (scalar_difference_op<double,_double> *)&local_3e0);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>_>
                             *)local_298,&local_d8,
                            (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                             *)local_318,(scalar_product_op<double,_double> *)&local_3e0);
            if (((local_1d8.m_expression)->
                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.m_cols ==
                0) {
              local_3e8 = 0.0;
            }
            else {
              local_3e8 = Eigen::
                          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,-1,-1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>const>const>>
                          ::redux<Eigen::internal::scalar_sum_op<double,double>>
                                    ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,_1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const>const>>
                                      *)local_298,(scalar_sum_op<double,_double> *)&local_3e0);
            }
            index = (ulong)uVar17;
            pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                                 index);
            uVar3 = local_444;
            *pSVar10 = local_3e8;
            pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                                 index);
            uVar5 = local_440;
            uVar4 = local_444;
            *pSVar10 = (double)(uVar3 * 2 + 3) * *pSVar10;
            pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                                 index);
            *pSVar10 = (double)((uVar4 + uVar5) * 2 + 5) * *pSVar10;
            uVar17 = uVar17 + 1;
            free(local_388[0]);
            free(local_378.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                 m_data);
            local_440 = local_440 + 1;
          } while (local_440 <
                   ((int)(local_3f0->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                         .m_storage.m_cols - local_444) - 2);
        }
        pMVar7 = local_3f0;
        free(local_368.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data);
        free(local_408.m_storage.m_data);
        free(local_428.m_storage.m_data);
        local_444 = local_444 + 1;
      } while (local_444 <
               (int)(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                    m_storage.m_cols - 2U);
    }
    free(local_438.m_storage.m_data);
    free(local_3d8.m_data);
    free(local_3c8.m_data);
    IVar14 = extraout_RDX_00;
  }
  MVar21.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = IVar14;
  MVar21.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar21.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToFaceDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const {
    const auto Ns0 = edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const auto Ns1 = edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const auto Ns2 = edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const lf::base::size_type Ns = Ns0 + Ns1 + Ns2;
    const lf::base::size_type Nt = qr_dual_tria_->NumPoints();
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions(0));
    if (interior_degree_ > 2) {
      unsigned idx = 0;
      const Eigen::Matrix<double, 1, Eigen::Dynamic> xnorm =
          (qr_dual_tria_->Points().row(0).array() /
           qr_dual_tria_->Points().row(1).array().unaryExpr([&](double y) {
             return 1 - y;
           })).matrix();
      // We need to flip the local coordinates in case the
      // relative orientation is negative
      const Eigen::Matrix<double, 1, Eigen::Dynamic> xnorm_adj =
          rel_orient_[0] == lf::mesh::Orientation::positive
              ? xnorm
              : Eigen::RowVectorXd::Ones(Nt) - xnorm;
      const Eigen::Matrix<double, 1, Eigen::Dynamic> y =
          qr_dual_tria_->Points().row(1);
      // i is the degree of the edge function
      for (unsigned i = 0; i < interior_degree_ - 2; ++i) {
        const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> ypow =
            y.array()
                .unaryExpr(
                    [&](double y) -> SCALAR { return std::pow(1 - y, i); })
                .matrix();
        const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> ypowp1 =
            y.array()
                .unaryExpr(
                    [&](double y) -> SCALAR { return std::pow(1 - y, i + 1); })
                .matrix();
        const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            xnorm_adj.unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i + 1, x); });
        // j is the degree of the blending Jacobi polynomial
        for (unsigned j = 0; j < interior_degree_ - i - 2; ++j) {
          const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> jacdd =
              qr_dual_tria_->Points().row(1).unaryExpr([&](double y) -> SCALAR {
                return JacobiDx(j, 2 * i + 4, y);
              });
          const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> jacd =
              qr_dual_tria_->Points().row(1).unaryExpr([&](double y) -> SCALAR {
                return IJacobiDx(j + 1, 2 * i + 4, y);
              });
          dofs[idx] =
              (qr_dual_tria_->Weights().transpose().array() *
               nodevals.block(0, 3 + Ns, 1, Nt).array() * psidd.array() *
               (ypowp1.array() * jacdd.array() -
                (2 * i + 4) * ypow.array() * jacd.array()))
                  .sum();
          dofs[idx] *=
              2 * i + 3;  // Normalization factor for the Legendre polynomial
          dofs[idx] *= 2 * j + 2 * i +
                       5;  // Normalization factor for the Jacobi Polynomial
          ++idx;
        }
      }
    }
    return dofs;
  }